

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::CheckPrivatelyLeakedFields(Parser *this,Definition *def,Definition *value_type)

{
  Value *pVVar1;
  Value *in_RCX;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90;
  Value *local_70;
  Value *is_field_private;
  allocator<char> local_51;
  string local_50;
  Value *local_30;
  Value *is_private;
  Definition *value_type_local;
  Definition *def_local;
  Parser *this_local;
  
  value_type_local = value_type;
  def_local = def;
  this_local = this;
  if ((def[8].name.field_0x7 & 1) == 0) {
    anon_unknown_0::NoError();
  }
  else {
    is_private = in_RCX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"private",&local_51);
    pVVar1 = SymbolTable<flatbuffers::Value>::Lookup(&value_type->attributes,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    local_30 = pVVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"private",&local_91);
    pVVar1 = SymbolTable<flatbuffers::Value>::Lookup
                       ((SymbolTable<flatbuffers::Value> *)&is_private[1].type.enum_def,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    local_70 = pVVar1;
    if ((local_30 == (Value *)0x0) && (pVVar1 != (Value *)0x0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_b8,
                 "Leaking private implementation, verify all objects have similar annotations",
                 &local_b9);
      Error(this,&def->name);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    else {
      anon_unknown_0::NoError();
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::CheckPrivatelyLeakedFields(const Definition &def,
                                                const Definition &value_type) {
  if (!opts.no_leak_private_annotations) return NoError();
  const auto is_private = def.attributes.Lookup("private");
  const auto is_field_private = value_type.attributes.Lookup("private");
  if (!is_private && is_field_private) {
    return Error(
        "Leaking private implementation, verify all objects have similar "
        "annotations");
  }
  return NoError();
}